

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

bool __thiscall
wasm::ValidationInfo::shouldBeEqual<wasm::Expression*,unsigned_long>
          (ValidationInfo *this,unsigned_long left,unsigned_long right,Expression *curr,char *text,
          Function *func)

{
  ostream *poVar1;
  ostringstream local_1d8 [8];
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Function *local_40;
  Expression *local_38;
  
  if (left != right) {
    local_40 = func;
    local_38 = curr;
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,text);
    std::__cxx11::stringbuf::str();
    fail<wasm::Expression*,std::__cxx11::string>(this,&local_60,local_38,local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  return left == right;
}

Assistant:

bool shouldBeEqual(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }